

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 IVar4;
  ImVec2 pos;
  ImGuiWindow *moving_window;
  ImGuiContext *g;
  ImGuiViewportP *in_stack_00000050;
  ImGuiWindow *in_stack_00000058;
  ImVec2 *in_stack_ffffffffffffffe8;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (GImGui->ActiveIdWindow->MoveId == GImGui->ActiveId)) &&
       (KeepAliveID(GImGui->ActiveId), ((pIVar2->IO).MouseDown[0] & 1U) == 0)) {
      ClearActiveID();
    }
  }
  else {
    KeepAliveID(GImGui->ActiveId);
    window = pIVar2->MovingWindow->RootWindow;
    if ((((pIVar2->IO).MouseDown[0] & 1U) == 0) ||
       (bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos), !bVar3)) {
      if ((pIVar2->ConfigFlagsCurrFrame & 0x400U) != 0) {
        UpdateTryMergeWindowIntoHostViewport(in_stack_00000058,in_stack_00000050);
      }
      bVar3 = IsDragDropPayloadBeingAccepted();
      if (!bVar3) {
        pIVar2->MouseViewport = window->Viewport;
      }
      (window->Viewport->super_ImGuiViewport).Flags =
           (window->Viewport->super_ImGuiViewport).Flags & 0xffffffef;
      ClearActiveID();
      pIVar2->MovingWindow = (ImGuiWindow *)0x0;
    }
    else {
      IVar4 = ::operator-(in_stack_ffffffffffffffe8,(ImVec2 *)0x1a9466);
      fVar1 = (window->Pos).x;
      if (((fVar1 != IVar4.x) || (NAN(fVar1) || NAN(IVar4.x))) ||
         ((fVar1 = (window->Pos).y, fVar1 != IVar4.y || (NAN(fVar1) || NAN(IVar4.y))))) {
        MarkIniSettingsDirty(window);
        SetWindowPos((ImGuiWindow *)g,(ImVec2 *)moving_window,(ImGuiCond)pos.y);
        if ((window->ViewportOwned & 1U) != 0) {
          (window->Viewport->super_ImGuiViewport).Pos = IVar4;
        }
      }
      FocusWindow(window);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                    moving_window->Viewport->Pos = pos;
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            // Try to merge the window back into the main viewport.
            // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
            if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

            // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
            if (!IsDragDropPayloadBeingAccepted())
                g.MouseViewport = moving_window->Viewport;

            // Clear the NoInput window flag set by the Viewport system
            moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs;

            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}